

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform_data.h
# Opt level: O2

void __thiscall
draco::AttributeTransformData::SetParameterValue<float>
          (AttributeTransformData *this,int byte_offset,float *in_data)

{
  ulong size;
  pointer puVar1;
  
  size = (long)byte_offset + 4;
  puVar1 = (this->buffer_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buffer_).data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1) < size) {
    DataBuffer::Resize(&this->buffer_,size);
    puVar1 = (this->buffer_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  *(float *)(puVar1 + byte_offset) = *in_data;
  return;
}

Assistant:

void SetParameterValue(int byte_offset, const DataTypeT &in_data) {
    if (byte_offset + sizeof(DataTypeT) > buffer_.data_size()) {
      buffer_.Resize(byte_offset + sizeof(DataTypeT));
    }
    buffer_.Write(byte_offset, &in_data, sizeof(DataTypeT));
  }